

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkMiterCofactor(Abc_Ntk_t *pNtk,Vec_Int_t *vPiValues)

{
  Abc_Obj_t *pRoot;
  int iVar1;
  Abc_Ntk_t *pNtkMiter;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  char Buffer [1000];
  char acStack_418 [1008];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x1c9,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
  }
  if (pNtk->vCos->nSize != 1) {
    __assert_fail("1 == Abc_NtkCoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x1ca,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
  }
  if (pNtk->nObjCounts[8] != pNtk->vBoxes->nSize) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x1cb,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
  }
  pNtkMiter = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  sprintf(acStack_418,"%s_miter",pNtk->pName);
  pcVar2 = Extra_UtilStrsav(acStack_418);
  pNtkMiter->pName = pcVar2;
  if (0 < pNtk->vCos->nSize) {
    pRoot = (Abc_Obj_t *)*pNtk->vCos->pArray;
    Abc_NtkMiterPrepare(pNtk,pNtk,pNtkMiter,1,-1,0);
    if (0 < vPiValues->nSize) {
      lVar5 = 0;
      do {
        iVar1 = vPiValues->pArray[lVar5];
        if (iVar1 != -1) {
          if (iVar1 == 1) {
            pAVar3 = Abc_AigConst1(pNtkMiter);
            pVVar4 = pNtk->vCis;
            if (pVVar4->nSize <= lVar5) goto LAB_002d5d05;
          }
          else {
            if (iVar1 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                            ,0x1e6,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
            }
            pAVar3 = Abc_AigConst1(pNtkMiter);
            pVVar4 = pNtk->vCis;
            if (pVVar4->nSize <= lVar5) goto LAB_002d5d05;
            pAVar3 = (Abc_Obj_t *)((ulong)pAVar3 ^ 1);
          }
          *(Abc_Obj_t **)((long)pVVar4->pArray[lVar5] + 0x40) = pAVar3;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < vPiValues->nSize);
    }
    Abc_NtkMiterAddCone(pNtk,pNtkMiter,pRoot);
    if (0 < pNtkMiter->vPos->nSize) {
      Abc_ObjAddFanin((Abc_Obj_t *)*pNtkMiter->vPos->pArray,
                      (Abc_Obj_t *)
                      ((ulong)(*(uint *)&pRoot->field_0x14 >> 10 & 1) ^
                      *(ulong *)((long)pRoot->pNtk->vObjs->pArray[*(pRoot->vFanins).pArray] + 0x40))
                     );
      iVar1 = Abc_NtkCheck(pNtkMiter);
      if (iVar1 == 0) {
        puts("Abc_NtkMiterCofactor: The network check has failed.");
        Abc_NtkDelete(pNtkMiter);
        pNtkMiter = (Abc_Ntk_t *)0x0;
      }
      return pNtkMiter;
    }
  }
LAB_002d5d05:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterCofactor( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues )
{
    char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;
    Abc_Obj_t * pRoot, * pOutput1;
    int Value, i;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( 1 == Abc_NtkCoNum(pNtk) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );

    // start the new network
    pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_miter", pNtk->pName );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

    // get the root output
    pRoot = Abc_NtkCo( pNtk, 0 );

    // perform strashing
    Abc_NtkMiterPrepare( pNtk, pNtk, pNtkMiter, 1, -1, 0 );
    // set the first cofactor
    Vec_IntForEachEntry( vPiValues, Value, i )
    {
        if ( Value == -1 )
            continue;
        if ( Value == 0 )
        {
            Abc_NtkCi(pNtk, i)->pCopy = Abc_ObjNot( Abc_AigConst1(pNtkMiter) );
            continue;
        }
        if ( Value == 1 )
        {
            Abc_NtkCi(pNtk, i)->pCopy = Abc_AigConst1(pNtkMiter);
            continue;
        }
        assert( 0 );
    }
    // add the first cofactor
    Abc_NtkMiterAddCone( pNtk, pNtkMiter, pRoot );

    // save the output
    pOutput1 = Abc_ObjNotCond( Abc_ObjFanin0(pRoot)->pCopy, Abc_ObjFaninC0(pRoot) );

    // create the miter of the two outputs
    Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pOutput1 );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkMiter ) )
    {
        printf( "Abc_NtkMiterCofactor: The network check has failed.\n" );
        Abc_NtkDelete( pNtkMiter );
        return NULL;
    }
    return pNtkMiter;
}